

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O2

art_erase_result_t *
art_erase_at(art_erase_result_t *__return_storage_ptr__,art_t *art,art_ref_t ref,
            art_key_chunk_t *key,uint8_t depth)

{
  byte *pbVar1;
  byte key1_to;
  art_key_chunk_t key_chunk;
  uint8_t offset;
  byte bVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  art_ref_t aVar6;
  uint8_t in_R9B;
  long lVar7;
  art_inner_node_t *node;
  art_typecode_t typecode;
  art_typecode_t typecode_00;
  art_node_t *node_00;
  art_erase_result_t child_result;
  
  __return_storage_ptr__->rootmost_node = 0;
  __return_storage_ptr__->erased = false;
  typecode_00 = (art_typecode_t)ref;
  uVar3 = ref & 0xff;
  if (uVar3 == 1) {
    node_00 = (art_node_t *)((ref >> 0xc & 0xfffffffffffffff0) + (long)art->nodes[1]);
    for (lVar4 = 0; lVar4 != 6; lVar4 = lVar4 + 1) {
      if (*(art_key_chunk_t *)((long)node_00 + lVar4) != key[lVar4]) {
        if (lVar4 != 6) {
          return __return_storage_ptr__;
        }
        break;
      }
    }
    __return_storage_ptr__->erased = true;
    __return_storage_ptr__->value_erased = *(art_val_t *)((long)node_00 + 8);
    art_node_free(art,node_00,'\x01');
  }
  else {
    uVar5 = (ulong)(uint)((int)uVar3 * 8);
    lVar4 = *(long *)((long)art->nodes + uVar5);
    lVar7 = (ref >> 0x10) * *(long *)((long)ART_NODE_SIZES + uVar5);
    pbVar1 = (byte *)(lVar4 + lVar7);
    key1_to = *pbVar1;
    bVar2 = art_common_prefix(pbVar1 + 1,'\0',key1_to,key,depth,in_R9B);
    if (bVar2 == key1_to) {
      key_chunk = key[(ulong)key1_to + (ulong)depth];
      aVar6 = art_find_child((art_inner_node_t *)(lVar4 + lVar7),typecode_00,key_chunk);
      if ((aVar6 != 0) &&
         (art_erase_at(&child_result,art,aVar6,key,(char)((ulong)key1_to + (ulong)depth) + '\x01'),
         child_result.erased == true)) {
        __return_storage_ptr__->erased = true;
        __return_storage_ptr__->value_erased = child_result.value_erased;
        __return_storage_ptr__->rootmost_node = ref;
        node = (art_inner_node_t *)(lVar7 + (long)art->nodes[uVar3]);
        if (child_result.rootmost_node == 0) {
          aVar6 = art_node_erase(art,node,typecode_00,key_chunk);
          __return_storage_ptr__->rootmost_node = aVar6;
        }
        else if (child_result.rootmost_node != aVar6) {
          art_replace(node,typecode_00,key_chunk,child_result.rootmost_node);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static art_erase_result_t art_erase_at(art_t *art, art_ref_t ref,
                                       const art_key_chunk_t *key,
                                       uint8_t depth) {
    art_erase_result_t result;
    result.rootmost_node = CROARING_ART_NULL_REF;
    result.erased = false;

    if (art_is_leaf(ref)) {
        art_leaf_t *leaf = (art_leaf_t *)art_deref(art, ref);
        uint8_t common_prefix = art_common_prefix(leaf->key, 0, ART_KEY_BYTES,
                                                  key, 0, ART_KEY_BYTES);
        if (common_prefix != ART_KEY_BYTES) {
            // Leaf key mismatch.
            return result;
        }
        result.erased = true;
        result.value_erased = leaf->val;
        art_node_free(art, (art_node_t *)leaf, CROARING_ART_LEAF_TYPE);
        return result;
    }
    art_inner_node_t *inner_node = (art_inner_node_t *)art_deref(art, ref);
    uint8_t common_prefix =
        art_common_prefix(inner_node->prefix, 0, inner_node->prefix_size, key,
                          depth, ART_KEY_BYTES);
    if (common_prefix != inner_node->prefix_size) {
        // Prefix mismatch.
        return result;
    }
    art_key_chunk_t key_chunk = key[depth + common_prefix];
    art_ref_t child =
        art_find_child(inner_node, art_ref_typecode(ref), key_chunk);
    if (child == CROARING_ART_NULL_REF) {
        // No child with key chunk.
        return result;
    }
    // Try to erase the key further down. Skip the key chunk associated with
    // the child in the node.
    art_erase_result_t child_result =
        art_erase_at(art, child, key, depth + common_prefix + 1);
    if (!child_result.erased) {
        return result;
    }
    result.erased = true;
    result.value_erased = child_result.value_erased;
    result.rootmost_node = ref;

    // Deref again as nodes may have changed location.
    inner_node = (art_inner_node_t *)art_deref(art, ref);
    if (child_result.rootmost_node == CROARING_ART_NULL_REF) {
        // Child node was fully erased, erase it from this node's children.
        result.rootmost_node =
            art_node_erase(art, inner_node, art_ref_typecode(ref), key_chunk);
    } else if (child_result.rootmost_node != child) {
        // Child node was not fully erased, update the pointer to it in this
        // node.
        art_replace(inner_node, art_ref_typecode(ref), key_chunk,
                    child_result.rootmost_node);
    }
    return result;
}